

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_session_event_timer_cb(epoll_event *ev)

{
  short *psVar1;
  uint64_t uVar2;
  undefined1 local_18 [8];
  uint64_t res;
  
  uVar2 = (ev->data).u64;
  read(*(int *)(uVar2 + 0xc),local_18,8);
  psVar1 = (short *)(uVar2 + 0xba);
  *psVar1 = *psVar1 + -1;
  if (*psVar1 != 0) {
    return;
  }
  nh_session_free((nh_session_t *)(uVar2 - 8));
  return;
}

Assistant:

void nh_session_event_timer_cb(struct epoll_event *ev) {
    // data.ptr = &session->timer_handler
    // data.ptr - sizeof(ev_handler_t) = &session
    nh_session_t *session = (nh_session_t *) (ev->data.ptr - sizeof(ev_handler_t));
    uint64_t res;
    read(session->timer_fd, &res, sizeof(res));
    if (--session->timeout == 0) {
        nh_session_free(session);
    }
}